

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iibmalloc.h
# Opt level: O1

void __thiscall
nodecpp::iibmalloc::
BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>::
deallocate(BulkAllocator<nodecpp::iibmalloc::PageAllocatorWithCaching,_8388608UL,_(unsigned_short)32>
           *this,void *ptr)

{
  ushort uVar1;
  ulong uVar2;
  uint *puVar3;
  ushort uVar4;
  size_t deallocSize;
  FreeChunkHeader *pFVar5;
  
  uVar2 = *ptr;
  if ((uVar2 & 0xfff) != 0) {
    if (0x20 < ((uint)uVar2 & 0xfff)) {
      assert::onAssertionFailed
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                 ,0x2c2,"h->getPageCount() <= max_pages",true);
    }
    pFVar5 = (FreeChunkHeader *)(*ptr & 0xfffffffffffff000);
    if ((pFVar5 != (FreeChunkHeader *)0x0) && (((pFVar5->super_AnyChunkHeader).next & 0xfff) != 0))
    {
      uVar2 = (pFVar5->super_AnyChunkHeader).prev & 0xfffffffffffff000;
      if ((uVar2 != 0) && ((*(ushort *)(uVar2 + 8) & 0xfff) != 0)) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2cb,"prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree()",true);
      }
      if ((void *)((pFVar5->super_AnyChunkHeader).next & 0xfffffffffffff000) != ptr) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2cc,"prev->nextInBlock() == h",true);
      }
      puVar3 = (uint *)((pFVar5->super_AnyChunkHeader).prev & 0xfffffffffffff000);
      if ((void *)((ulong)((*puVar3 & 0xfff) << 0xc) + (long)puVar3) != ptr) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2cd,
                   "reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h )"
                   ,true);
      }
      removeFromFreeList(this,pFVar5);
      uVar2 = (pFVar5->super_AnyChunkHeader).prev;
      AnyChunkHeader::set((AnyChunkHeader *)pFVar5,(AnyChunkHeader *)(uVar2 & 0xfffffffffffff000),
                          (AnyChunkHeader *)(*(ulong *)((long)ptr + 8) & 0xfffffffffffff000),
                          (*ptr & 0xfff) + ((ushort)uVar2 & 0xfff),true);
      ptr = pFVar5;
    }
    pFVar5 = (FreeChunkHeader *)
             ((((FreeChunkHeader *)ptr)->super_AnyChunkHeader).next & 0xfffffffffffff000);
    if ((pFVar5 != (FreeChunkHeader *)0x0) &&
       (uVar2 = (pFVar5->super_AnyChunkHeader).next, (uVar2 & 0xfff) != 0)) {
      uVar2 = uVar2 & 0xfffffffffffff000;
      if ((uVar2 != 0) && ((*(ushort *)(uVar2 + 8) & 0xfff) != 0)) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2d5,"next->nextInBlock() == nullptr || !next->nextInBlock()->isFree()",true);
      }
      if ((FreeChunkHeader *)ptr !=
          (FreeChunkHeader *)((pFVar5->super_AnyChunkHeader).prev & 0xfffffffffffff000)) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2d6,"next->prevInBlock() == h",true);
      }
      if ((FreeChunkHeader *)
          ((long)&(((FreeChunkHeader *)ptr)->super_AnyChunkHeader).prev +
          (ulong)(((uint)(((FreeChunkHeader *)ptr)->super_AnyChunkHeader).prev & 0xfff) << 0xc)) !=
          pFVar5) {
        assert::onAssertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/node-dot-cpp[P]iibmalloc/src/iibmalloc.h"
                   ,0x2d7,
                   "reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next )"
                   ,true);
      }
      removeFromFreeList(this,pFVar5);
      uVar2 = (((FreeChunkHeader *)ptr)->super_AnyChunkHeader).prev;
      AnyChunkHeader::set((AnyChunkHeader *)ptr,(AnyChunkHeader *)(uVar2 & 0xfffffffffffff000),
                          (AnyChunkHeader *)
                          ((pFVar5->super_AnyChunkHeader).next & 0xfffffffffffff000),
                          ((ushort)(pFVar5->super_AnyChunkHeader).prev & 0xfff) +
                          ((ushort)uVar2 & 0xfff),true);
    }
    uVar1 = ((ushort)(((FreeChunkHeader *)ptr)->super_AnyChunkHeader).prev & 0xfff) - 1;
    uVar4 = 0x20;
    if (uVar1 < 0x20) {
      uVar4 = uVar1;
    }
    ((FreeChunkHeader *)ptr)->prevFree = (FreeChunkHeader *)0x0;
    ((FreeChunkHeader *)ptr)->nextFree = this->freeListBegin[uVar4];
    if (this->freeListBegin[uVar4] != (FreeChunkHeader *)0x0) {
      this->freeListBegin[uVar4]->prevFree = (FreeChunkHeader *)ptr;
    }
    this->freeListBegin[uVar4] = (FreeChunkHeader *)ptr;
    return;
  }
  PageAllocatorWithCaching::freeChunkNoCache(&this->super_PageAllocatorWithCaching,ptr,uVar2);
  return;
}

Assistant:

void deallocate( void* ptr )
	{
		AnyChunkHeader* h = reinterpret_cast<AnyChunkHeader*>( ptr );
		if ( h->getPageCount() != 0 )
		{
			NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, h->getPageCount() <= max_pages );
#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif

			AnyChunkHeader* prev = h->prevInBlock();
			if ( prev && prev->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->prevInBlock() == nullptr || !prev->prevInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, prev->nextInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(prev->prevInBlock()) + ((uintptr_t)(prev->prevInBlock()->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( h ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(prev) );
				prev->set( prev->prevInBlock(), h->nextInBlock(), prev->getPageCount() + h->getPageCount(), true );
				h = prev;
			}
			AnyChunkHeader* next = h->nextInBlock();
			if ( next && next->isFree() )
			{
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->nextInBlock() == nullptr || !next->nextInBlock()->isFree() );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, next->prevInBlock() == h );
				NODECPP_ASSERT(nodecpp::iibmalloc::module_id, nodecpp::assert::AssertLevel::critical, reinterpret_cast<uint8_t*>(h) + ((uintptr_t)(h->getPageCount()) << PAGE_SIZE_EXP) == reinterpret_cast<uint8_t*>( next ) );
				removeFromFreeList( static_cast<FreeChunkHeader*>(next) );
				h->set( h->prevInBlock(), next->nextInBlock(), h->getPageCount() + next->getPageCount(), true );
			}

			FreeChunkHeader* hfree = static_cast<FreeChunkHeader*>(h);
			uint16_t idx = hfree->getPageCount() - 1;
			if ( idx >= max_pages )
				idx = max_pages;
			hfree->prevFree = nullptr;
			hfree->nextFree = freeListBegin[idx];
			if ( freeListBegin[idx] != nullptr )
				freeListBegin[idx]->prevFree = hfree;
			freeListBegin[idx] = hfree;

#ifdef BULKALLOCATOR_HEAVY_DEBUG
		dbgValidateAllBlocks();
		dbgValidateAllFreeLists();
#endif
		}
		else
		{
			size_t deallocSize = (size_t)(h->prevInBlock());
			this->freeChunkNoCache( ptr, deallocSize );
		}

	}